

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O1

bool __thiscall dg::pta::PointerAnalysisFSInv::afterProcessed(PointerAnalysisFSInv *this,PSNode *n)

{
  int iVar1;
  undefined8 *puVar2;
  long *plVar3;
  MemoryMapT *mm;
  bool bVar4;
  bool bVar5;
  long *plVar6;
  undefined8 *puVar7;
  
  iVar1 = *(int *)(n + 0x90);
  if (iVar1 == 0x11) {
    bVar5 = invalidateMemory(n);
    return bVar5;
  }
  if (iVar1 != 0x10) {
    if (iVar1 == 0xf) {
      puVar2 = *(undefined8 **)(n + 0x48);
      bVar5 = false;
      for (puVar7 = *(undefined8 **)(n + 0x40); puVar7 != puVar2; puVar7 = puVar7 + 1) {
        bVar4 = handleInvalidateLocals(n,(PSNode *)*puVar7);
        bVar5 = (bool)(bVar5 | bVar4);
      }
    }
    else {
      bVar5 = PointerAnalysisFS::afterProcessed(&this->super_PointerAnalysisFS,n);
      plVar6 = *(long **)(n + 0x40);
      if ((8 < (ulong)(*(long *)(n + 0x48) - (long)plVar6)) &&
         (plVar3 = *(long **)(n + 0x48), plVar6 != plVar3)) {
        mm = *(MemoryMapT **)(n + 0x10);
        do {
          if (*(MemoryMapT **)(*plVar6 + 0x10) != (MemoryMapT *)0x0) {
            bVar4 = handleUninitialized(this,mm,*(MemoryMapT **)(*plVar6 + 0x10));
            bVar5 = (bool)(bVar5 | bVar4);
          }
          plVar6 = plVar6 + 1;
        } while (plVar6 != plVar3);
      }
    }
    return bVar5;
  }
  bVar5 = handleFree(n);
  return bVar5;
}

Assistant:

bool afterProcessed(PSNode *n) override {
        if (n->getType() == PSNodeType::INVALIDATE_LOCALS)
            return handleInvalidateLocals(n);
        if (n->getType() == PSNodeType::INVALIDATE_OBJECT)
            return invalidateMemory(n);
        if (n->getType() == PSNodeType::FREE)
            return handleFree(n);

        assert(n->getType() != PSNodeType::FREE &&
               n->getType() != PSNodeType::INVALIDATE_OBJECT &&
               n->getType() != PSNodeType::INVALIDATE_LOCALS);

        bool ret = PointerAnalysisFS::afterProcessed(n);

        // check that all pointers in this memory map
        // are initialized in all predecessors and
        // set them to invalidated otherwise
        MemoryMapT *mm = n->getData<MemoryMapT>();
        assert(mm && "Do not have memory map");
        if (n->predecessorsNum() > 1) {
            for (PSNode *p : n->predecessors()) {
                if (MemoryMapT *pm = p->getData<MemoryMapT>()) {
                    ret |= handleUninitialized(mm, pm);
                }
            }
        }
        return ret;
    }